

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O2

char * __cxxabiv1::anon_unknown_0::parse_source_name<__cxxabiv1::(anonymous_namespace)::Db>
                 (char *first,char *last,Db *db)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar1;
  char cVar2;
  bool bVar3;
  char *__n;
  char *pcVar4;
  char *pcVar5;
  String r;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_88;
  value_type local_68;
  
  if (((first != last) && ((int)*first - 0x30U < 10)) && (pcVar5 = first + 1, pcVar5 != last)) {
    pcVar4 = (char *)(ulong)((int)*first - 0x30U);
    __n = last + ~(ulong)first;
    while (cVar2 = *pcVar5, 0xfffffff5 < (int)cVar2 - 0x3aU) {
      pcVar5 = pcVar5 + 1;
      if (pcVar5 == last) {
        return first;
      }
      pcVar4 = (char *)((ulong)((int)cVar2 - 0x30) + (long)pcVar4 * 10);
      __n = __n + -1;
    }
    if (pcVar4 <= __n) {
      paVar1 = &r.field_2;
      first = pcVar4 + (long)pcVar5;
      r._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::
      basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
      ::_M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
                  *)&r,pcVar5,first);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::substr(&local_68.first,&r,10,(size_type)__n);
      bVar3 = std::operator==(&local_68.first,"_GLOBAL__N");
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::_M_dispose(&local_68.first);
      if (bVar3) {
        local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
        std::__cxx11::
        basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
        ::_M_construct<char_const*>
                  ((basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
                    *)&local_68,"(anonymous namespace)","");
        local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
        local_68.second._M_string_length = 0;
        local_68.second.field_2._M_local_buf[0] = '\0';
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back(&db->names,&local_68);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(&local_68);
      }
      else {
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
             *)r._M_dataplus._M_p == paVar1) {
          local_88.field_2._8_8_ = r.field_2._8_8_;
        }
        else {
          local_88._M_dataplus._M_p = r._M_dataplus._M_p;
        }
        local_88._M_string_length = r._M_string_length;
        r._M_string_length = 0;
        r.field_2._M_local_buf[0] = '\0';
        r._M_dataplus._M_p = (pointer)paVar1;
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::string_pair(&local_68,&local_88);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back(&db->names,&local_68);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(&local_68);
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
        ::_M_dispose(&local_88);
      }
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::_M_dispose(&r);
    }
  }
  return first;
}

Assistant:

const char*
parse_source_name(const char* first, const char* last, C& db)
{
    if (first != last)
    {
        char c = *first;
        if (isdigit(c) && first+1 != last)
        {
            const char* t = first+1;
            size_t n = static_cast<size_t>(c - '0');
            for (c = *t; isdigit(c); c = *t)
            {
                n = n * 10 + static_cast<size_t>(c - '0');
                if (++t == last)
                    return first;
            }
            if (static_cast<size_t>(last - t) >= n)
            {
                typename C::String r(t, n);
                if (r.substr(0, 10) == "_GLOBAL__N")
                    db.names.push_back("(anonymous namespace)");
                else
                    db.names.push_back(std::move(r));
                first = t + n;
            }
        }
    }
    return first;
}